

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O2

ptr<async_result<bool>_> __thiscall
cornerstone::raft_server::add_srv(raft_server *this,srv_config *srv)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ptr<async_result<bool>_> pVar1;
  ptr<req_msg> req;
  msg_type local_68 [2];
  ptr<log_entry> log;
  undefined4 local_4c;
  int local_48 [2];
  bufptr buf;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_28;
  
  srv_config::serialize((srv_config *)&buf);
  req.super___shared_ptr<cornerstone::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
  local_68[0] = 3;
  std::
  make_shared<cornerstone::log_entry,int,std::unique_ptr<cornerstone::buffer,void(*)(cornerstone::buffer*)>,cornerstone::log_val_type>
            ((int *)&log,(unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)> *)&req,
             (log_val_type *)&buf);
  local_68[0] = 0;
  local_68[1] = 0;
  local_48[1] = 6;
  local_48[0] = 0;
  local_4c = 0;
  local_28._8_8_ = 0;
  local_28._M_allocated_capacity = 0;
  std::
  make_shared<cornerstone::req_msg,unsigned_long,cornerstone::msg_type,int,int,unsigned_long,unsigned_long,unsigned_long>
            ((unsigned_long *)&req,local_68,local_48 + 1,local_48,(unsigned_long *)&local_4c,
             (unsigned_long *)(local_28._M_local_buf + 8),&local_28._M_allocated_capacity);
  std::
  vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
  ::push_back((vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
               *)(CONCAT44(req.super___shared_ptr<cornerstone::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr._4_4_,
                           req.super___shared_ptr<cornerstone::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr._0_4_) + 0x38),&log);
  send_msg_to_leader(this,(ptr<req_msg> *)srv);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&req.super___shared_ptr<cornerstone::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&log.super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>::~unique_ptr(&buf);
  pVar1.
  super___shared_ptr<cornerstone::async_result<bool,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  pVar1.
  super___shared_ptr<cornerstone::async_result<bool,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (ptr<async_result<bool>_>)
         pVar1.
         super___shared_ptr<cornerstone::async_result<bool,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

ptr<async_result<bool>> raft_server::add_srv(const srv_config& srv)
{
    bufptr buf(srv.serialize());
    ptr<log_entry> log(cs_new<log_entry>(0, std::move(buf), log_val_type::cluster_server));
    ptr<req_msg> req(cs_new<req_msg>((ulong)0, msg_type::add_server_request, 0, 0, (ulong)0, (ulong)0, (ulong)0));
    req->log_entries().push_back(log);
    return send_msg_to_leader(req);
}